

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_CheckLOF(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  player_t *ppVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  AActor *other;
  sector_t_conflict *sector;
  uint uVar5;
  int selector;
  char *pcVar6;
  AActor *origin;
  undefined4 uVar7;
  undefined4 uVar8;
  sector_t *v;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  void *local_1e8;
  void *local_1d8;
  double local_1b0;
  sector_t *local_1a8;
  FTextureID FStack_1a0;
  undefined4 uStack_19c;
  double local_180;
  ActorFlags local_15c;
  DVector3 local_158;
  DVector3 local_138;
  LOFData lof_data;
  FTraceResults trace;
  
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003e6a91;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e6a81:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e6a91:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xfd6,
                  "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  origin = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003e62ac;
    bVar3 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e6a91;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003e6a81;
LAB_003e62ac:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e6b9b:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd7,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar5 = param[1].field_0.i;
LAB_003e630d:
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e6bba:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd8,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar7 = (undefined4)*(undefined8 *)&param[2].field_0;
    uVar8 = (undefined4)((ulong)*(undefined8 *)&param[2].field_0 >> 0x20);
LAB_003e631e:
    local_1b0 = (double)CONCAT44(uVar8,uVar7);
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e6b6a:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd9,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar7 = (undefined4)*(undefined8 *)&param[3].field_0;
    uVar8 = (undefined4)((ulong)*(undefined8 *)&param[3].field_0 >> 0x20);
LAB_003e6335:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e6b4b:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfda,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_1d8 = param[4].field_0.field_1.a;
LAB_003e634c:
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e6b2c:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdb,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_1e8 = param[5].field_0.field_1.a;
LAB_003e635d:
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e6b0d:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdc,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    dVar10 = param[6].field_0.f;
LAB_003e636e:
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e6aee:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdd,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_1a8 = (sector_t *)param[7].field_0.f;
LAB_003e6385:
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e6acf:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfde,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar4 = param[8].field_0.i;
LAB_003e639a:
    local_180 = (double)CONCAT44(uVar8,uVar7);
    if (param[9].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e6ab0:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdf,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e6b9b;
    }
    uVar5 = param[1].field_0.i;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e630d;
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e6bba;
    }
    local_1b0 = param[2].field_0.f;
    uVar7 = SUB84(local_1b0,0);
    uVar8 = (undefined4)((ulong)local_1b0 >> 0x20);
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003e631e;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e6b6a;
    }
    local_180 = param[3].field_0.f;
    uVar7 = SUB84(local_180,0);
    uVar8 = (undefined4)((ulong)local_180 >> 0x20);
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003e6335;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e6b4b;
    }
    local_1d8 = (void *)param[4].field_0.f;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003e634c;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e6b2c;
    }
    local_1e8 = (void *)param[5].field_0.f;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003e635d;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e6b0d;
    }
    dVar10 = param[6].field_0.f;
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003e636e;
    }
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e6aee;
    }
    local_1a8 = (sector_t *)param[7].field_0.f;
    if ((uint)numparam < 9) {
      param = defaultparam->Array;
      goto LAB_003e6385;
    }
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e6acf;
    }
    iVar4 = param[8].field_0.i;
    if (numparam == 9) {
      param = defaultparam->Array;
      goto LAB_003e639a;
    }
    if (param[9].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e6ab0;
    }
  }
  dVar11 = param[9].field_0.f;
  selector = 0x13;
  if (iVar4 != 0) {
    selector = iVar4;
  }
  other = COPY_AAPTR(origin,selector);
  if ((uVar5 >> 0x13 & 1) != 0) {
    ppVar1 = origin->player;
    if (ppVar1 == (player_t *)0x0) {
      dVar10 = dVar10 * origin->Height;
    }
    else {
      dVar10 = dVar10 * (ppVar1->mo->super_AActor).Height * ppVar1->crouchfactor;
    }
  }
  if ((uVar5 >> 0x14 & 1) != 0) {
    dVar11 = dVar11 * origin->radius;
    local_1a8 = (sector_t *)((double)local_1a8 * origin->radius);
  }
  dVar12 = (dVar10 - origin->Floorclip) + (origin->__Pos).Z;
  if ((uVar5 >> 0x12 & 1) == 0) {
    ppVar1 = origin->player;
    if (ppVar1 == (player_t *)0x0) {
      dVar9 = 8.0;
    }
    else {
      dVar9 = ppVar1->mo->AttackZOffset * ppVar1->crouchfactor;
    }
    dVar12 = dVar12 + origin->Height * 0.5 + dVar9;
  }
  local_158.Z = dVar12;
  if (other == (AActor *)0x0) {
    if ((uVar5 >> 0xc & 1) != 0) {
      local_1d8 = (void *)((double)local_1d8 + (origin->Angles).Yaw.Degrees);
      dVar9 = (double)local_1e8 + (origin->Angles).Pitch.Degrees;
      dVar10 = fastsindeg((double)local_1d8);
      dVar12 = fastcosdeg((double)local_1d8);
      AActor::Vec2Offset((AActor *)&trace,(double)local_1a8 * dVar10 + dVar11 * dVar12,
                         dVar11 * dVar10 - (double)local_1a8 * dVar12,SUB81(origin,0));
      local_1a8 = trace.Sector;
      FStack_1a0.texnum = trace.HitTexture.texnum;
      uStack_19c = trace._12_4_;
      local_158.X = (double)trace.Sector;
      local_158.Y = (double)trace._8_8_;
      goto LAB_003e6721;
    }
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1040,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else if (((local_1b0 <= 0.0) || ((uVar5 & 0x2000) != 0)) ||
          (dVar9 = AActor::Distance3D(origin,other,false), dVar9 <= local_1b0)) {
    if ((uVar5 & 2) == 0) {
      AActor::AngleTo((AActor *)&trace,origin,SUB81(other,0));
      v = trace.Sector;
    }
    else {
      v = (sector_t *)(origin->Angles).Yaw.Degrees;
    }
    local_1d8 = (void *)((double)local_1d8 + (double)v);
    dVar9 = fastsindeg((double)v);
    dVar2 = fastcosdeg((double)v);
    AActor::Vec2Offset((AActor *)&trace,(double)local_1a8 * dVar9 + dVar11 * dVar2,
                       dVar11 * dVar9 - (double)local_1a8 * dVar2,SUB81(origin,0));
    local_1a8 = trace.Sector;
    FStack_1a0.texnum = trace.HitTexture.texnum;
    uStack_19c = trace._12_4_;
    local_158.X = (double)trace.Sector;
    local_158.Y = (double)trace._8_8_;
    dVar11 = AActor::Distance2D(origin,other,false);
    if ((uVar5 & 1) == 0) {
      dVar12 = (other->Height * 0.5 + (other->__Pos).Z) - dVar12;
      if ((uVar5 >> 0x16 & 1) != 0) {
        dVar12 = dVar10 + dVar12;
      }
      dVar10 = c_atan2(dVar12,dVar11);
      dVar9 = (double)local_1e8 + dVar10 * -57.29577951308232;
    }
    else {
      dVar9 = (double)local_1e8 + (origin->Angles).Pitch.Degrees;
    }
LAB_003e6721:
    dVar10 = fastcosdeg(dVar9);
    dVar11 = fastcosdeg((double)local_1d8);
    dVar12 = fastsindeg((double)local_1d8);
    local_138.Z = fastsindeg(dVar9);
    local_138.Z = -local_138.Z;
    local_138.X = dVar11 * dVar10;
    local_138.Y = dVar12 * dVar10;
    trace.Sector = local_1a8;
    trace.HitTexture.texnum = FStack_1a0.texnum;
    trace._12_4_ = uStack_19c;
    sector = P_PointInSector((DVector2 *)&trace);
    uVar7 = SUB84(local_1b0,0);
    uVar8 = (undefined4)((ulong)local_1b0 >> 0x20);
    if ((local_1b0 == 0.0) && (!NAN(local_1b0))) {
      uVar7 = (undefined4)
              *(undefined8 *)(&DAT_005c93c0 + (ulong)(origin->player == (player_t *)0x0) * 8);
      uVar8 = (undefined4)
              ((ulong)*(undefined8 *)
                       (&DAT_005c93c0 + (ulong)(origin->player == (player_t *)0x0) * 8) >> 0x20);
    }
    lof_data.BadActor = false;
    local_15c.Value = 0xffffffff;
    lof_data.Self = origin;
    lof_data.Target = other;
    lof_data.Flags = uVar5;
    Trace(&local_158,sector,&local_138,(double)CONCAT44(uVar8,uVar7),&local_15c,0x8000,origin,&trace
          ,8,CheckLOFTraceFunc,&lof_data);
    if ((trace.HitType == TRACE_HitActor) ||
       ((((uVar5 >> 0x15 & 1) != 0 && (trace.HitType != TRACE_HitNone)) &&
        (lof_data.BadActor == false)))) {
      if ((local_180 <= 0.0) || (local_180 <= trace.Distance)) {
        if ((trace.Actor != (AActor *)0x0 && trace.HitType == TRACE_HitActor) &&
           (lof_data.BadActor == false)) {
          if ((uVar5 >> 0x17 & 1) != 0) {
            (origin->target).field_0.p = trace.Actor;
          }
          if ((uVar5 >> 0x18 & 1) != 0) {
            (origin->master).field_0.p = trace.Actor;
          }
          if ((uVar5 >> 0x19 & 1) != 0) {
            (origin->tracer).field_0.p = trace.Actor;
          }
        }
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x106e,
                        "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar4 = 1;
        goto LAB_003e6965;
      }
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1066,
                      "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
    }
    else {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1070,
                      "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
    }
  }
  else {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x100f,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  iVar4 = 0;
LAB_003e6965:
  VMReturn::SetInt(ret,iVar4);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckLOF)
{
	// Check line of fire

	/*
		Not accounted for / I don't know how it works: FLOORCLIP
	*/

	AActor *target;
	DVector3 pos;
	DVector3 vel;

	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)			
	PARAM_FLOAT_DEF	(range)			
	PARAM_FLOAT_DEF	(minrange)		
	PARAM_ANGLE_DEF	(angle)			
	PARAM_ANGLE_DEF	(pitch)			
	PARAM_FLOAT_DEF	(offsetheight)	
	PARAM_FLOAT_DEF	(offsetwidth)	
	PARAM_INT_DEF	(ptr_target)	
	PARAM_FLOAT_DEF	(offsetforward)	

	DAngle ang;

	target = COPY_AAPTR(self, ptr_target == AAPTR_DEFAULT ? AAPTR_TARGET|AAPTR_PLAYER_GETTARGET|AAPTR_NULL : ptr_target); // no player-support by default

	if (flags & CLOFF_MUL_HEIGHT)
	{
		if (self->player != NULL)
		{
			// Synced with hitscan: self->player->mo->height is strangely conscientious about getting the right actor for player
			offsetheight *= self->player->mo->Height * self->player->crouchfactor;
		}
		else
		{
			offsetheight *= self->Height;
		}
	}
	if (flags & CLOFF_MUL_WIDTH)
	{
		offsetforward *= self->radius;
		offsetwidth *= self->radius;
}
		
	pos = self->PosPlusZ(offsetheight - self->Floorclip);

		if (!(flags & CLOFF_FROMBASE))
		{ // default to hitscan origin

			// Synced with hitscan: self->Height is strangely NON-conscientious about getting the right actor for player
			pos.Z += self->Height *0.5;
			if (self->player != NULL)
			{
				pos.Z += self->player->mo->AttackZOffset * self->player->crouchfactor;
			}
			else
			{
				pos.Z += 8;
			}
		}

		if (target)
		{
			if (range > 0 && !(flags & CLOFF_CHECKPARTIAL))
			{
				double distance = self->Distance3D(target);
				if (distance > range)
				{
					ACTION_RETURN_BOOL(false);
				}
			}

			if (flags & CLOFF_NOAIM_HORZ)
			{
				ang = self->Angles.Yaw;
			}
			else ang = self->AngleTo (target);
				
			angle += ang;

			double s = ang.Sin();
			double c = ang.Cos();
				
			DVector2 xy = self->Vec2Offset(offsetforward * c + offsetwidth * s, offsetforward * s - offsetwidth * c);

			pos.X = xy.X;
			pos.Y = xy.Y;

			double xydist = self->Distance2D(target);
			if (flags & CLOFF_NOAIM_VERT)
			{
				pitch += self->Angles.Pitch;
			}
			else if (flags & CLOFF_AIM_VERT_NOOFFSET)
			{
				pitch -= VecToAngle(xydist, target->Center() - pos.Z + offsetheight);
			}
			else
			{
				pitch -= VecToAngle(xydist, target->Center() - pos.Z);
			}
		}
		else if (flags & CLOFF_ALLOWNULL)
		{
			angle += self->Angles.Yaw;
			pitch += self->Angles.Pitch;

			double s = angle.Sin();
			double c = angle.Cos();

			DVector2 xy = self->Vec2Offset(offsetforward * c + offsetwidth * s, offsetforward * s - offsetwidth * c);

			pos.X = xy.X;
			pos.Y = xy.Y;
		}
		else
		{
			ACTION_RETURN_BOOL(false);
		}

		double cp = pitch.Cos();

		vel = { cp * angle.Cos(), cp * angle.Sin(), -pitch.Sin() };

	/* Variable set:

		jump, flags, target
		pos (trace point of origin)
		vel (trace unit vector)
		range
	*/

	sector_t *sec = P_PointInSector(pos);

	if (range == 0)
	{
		range = (self->player != NULL) ? PLAYERMISSILERANGE : MISSILERANGE;
	}

	FTraceResults trace;
	LOFData lof_data;

	lof_data.Self = self;
	lof_data.Target = target;
	lof_data.Flags = flags;
	lof_data.BadActor = false;

	Trace(pos, sec, vel, range, ActorFlags::FromInt(0xFFFFFFFF), ML_BLOCKEVERYTHING, self, trace, TRACE_PortalRestrict,
		CheckLOFTraceFunc, &lof_data);

	if (trace.HitType == TRACE_HitActor ||
		((flags & CLOFF_JUMP_ON_MISS) && !lof_data.BadActor && trace.HitType != TRACE_HitNone))
	{
		if (minrange > 0 && trace.Distance < minrange)
		{
			ACTION_RETURN_BOOL(false);
		}
		if ((trace.HitType == TRACE_HitActor) && (trace.Actor != NULL) && !(lof_data.BadActor))
		{
			if (flags & (CLOFF_SETTARGET))	self->target = trace.Actor;
			if (flags & (CLOFF_SETMASTER))	self->master = trace.Actor;
			if (flags & (CLOFF_SETTRACER))	self->tracer = trace.Actor;
		}
		ACTION_RETURN_BOOL(true);
	}
	ACTION_RETURN_BOOL(false);
}